

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O1

int lj_cf_debug_getinfo(lua_State *L)

{
  byte bVar1;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  byte *what;
  lua_Integer lVar7;
  TValue *pTVar8;
  char *k;
  long lVar9;
  lua_State *L_00;
  int idx;
  lj_Debug ar;
  lj_Debug local_b0;
  
  lVar9 = 0;
  L_00 = L;
  if ((L->base < L->top) && (aVar2 = L->base->field_4, aVar2.it >> 0xf == 0x1fff9)) {
    lVar9 = 1;
    L_00 = (lua_State *)((ulong)aVar2 & 0x7fffffffffff);
  }
  iVar3 = (int)lVar9;
  what = (byte *)luaL_optlstring(L,iVar3 + 2,"flnSu",(size_t *)0x0);
  idx = iVar3 + 1;
  iVar6 = lua_isnumber(L,idx);
  if (iVar6 == 0) {
    pTVar8 = (TValue *)((ulong)(uint)(iVar3 * 8) + (long)L->base);
    if ((L->top <= pTVar8) || ((pTVar8->field_4).it >> 0xf != 0x1fff7)) {
      lj_err_arg(L,idx,LJ_ERR_NOFUNCL);
    }
    what = (byte *)lua_pushfstring(L,">%s",what);
    pTVar8 = L_00->top;
    L_00->top = pTVar8 + 1;
    pTVar8->u64 = L->base[lVar9].u64 & 0x7fffffffffff | 0xfffb800000000000;
  }
  else {
    lVar7 = lua_tointeger(L,idx);
    iVar6 = lua_getstack(L_00,(int)lVar7,(lua_Debug *)&local_b0);
    if (iVar6 == 0) {
      L->top[-1].u64 = 0xffffffffffffffff;
      return 1;
    }
  }
  iVar6 = lj_debug_getinfo(L_00,(char *)what,&local_b0,1);
  if (iVar6 == 0) {
    lj_err_arg(L,iVar3 + 2,LJ_ERR_INVOPT);
  }
  bVar5 = false;
  lua_createtable(L,0,0x10);
  bVar4 = false;
  do {
    bVar1 = *what;
    if (bVar1 < 0x6c) {
      if (bVar1 < 0x53) {
        if (bVar1 == 0x4c) {
          bVar4 = true;
        }
        else if (bVar1 == 0) {
          if (bVar4) {
            treatstackoption(L,L_00,"activelines");
          }
          if (bVar5) {
            treatstackoption(L,L_00,"func");
          }
          return 1;
        }
      }
      else {
        if (bVar1 == 0x53) {
          lua_pushstring(L,local_b0.source);
          lua_setfield(L,-2,"source");
          lua_pushstring(L,local_b0.short_src);
          lua_setfield(L,-2,"short_src");
          lua_pushinteger(L,(long)local_b0.linedefined);
          lua_setfield(L,-2,"linedefined");
          lua_pushinteger(L,(long)local_b0.lastlinedefined);
          lua_setfield(L,-2,"lastlinedefined");
          lua_pushstring(L,local_b0.what);
          k = "what";
          goto LAB_0015237b;
        }
        if (bVar1 == 0x66) {
          bVar5 = true;
        }
      }
    }
    else {
      if (bVar1 == 0x6c) {
        lua_pushinteger(L,(long)local_b0.currentline);
        k = "currentline";
      }
      else if (bVar1 == 0x6e) {
        lua_pushstring(L,local_b0.name);
        lua_setfield(L,-2,"name");
        lua_pushstring(L,local_b0.namewhat);
        k = "namewhat";
      }
      else {
        if (bVar1 != 0x75) goto LAB_00152380;
        lua_pushinteger(L,(long)local_b0.nups);
        lua_setfield(L,-2,"nups");
        lua_pushinteger(L,(long)local_b0.nparams);
        lua_setfield(L,-2,"nparams");
        lua_pushboolean(L,local_b0.isvararg);
        k = "isvararg";
      }
LAB_0015237b:
      lua_setfield(L,-2,k);
    }
LAB_00152380:
    what = what + 1;
  } while( true );
}

Assistant:

LJLIB_CF(debug_getinfo)
{
  lj_Debug ar;
  int arg, opt_f = 0, opt_L = 0;
  lua_State *L1 = getthread(L, &arg);
  const char *options = luaL_optstring(L, arg+2, "flnSu");
  if (lua_isnumber(L, arg+1)) {
    if (!lua_getstack(L1, (int)lua_tointeger(L, arg+1), (lua_Debug *)&ar)) {
      setnilV(L->top-1);
      return 1;
    }
  } else if (L->base+arg < L->top && tvisfunc(L->base+arg)) {
    options = lua_pushfstring(L, ">%s", options);
    setfuncV(L1, L1->top++, funcV(L->base+arg));
  } else {
    lj_err_arg(L, arg+1, LJ_ERR_NOFUNCL);
  }
  if (!lj_debug_getinfo(L1, options, &ar, 1))
    lj_err_arg(L, arg+2, LJ_ERR_INVOPT);
  lua_createtable(L, 0, 16);  /* Create result table. */
  for (; *options; options++) {
    switch (*options) {
    case 'S':
      settabss(L, "source", ar.source);
      settabss(L, "short_src", ar.short_src);
      settabsi(L, "linedefined", ar.linedefined);
      settabsi(L, "lastlinedefined", ar.lastlinedefined);
      settabss(L, "what", ar.what);
      break;
    case 'l':
      settabsi(L, "currentline", ar.currentline);
      break;
    case 'u':
      settabsi(L, "nups", ar.nups);
      settabsi(L, "nparams", ar.nparams);
      settabsb(L, "isvararg", ar.isvararg);
      break;
    case 'n':
      settabss(L, "name", ar.name);
      settabss(L, "namewhat", ar.namewhat);
      break;
    case 'f': opt_f = 1; break;
    case 'L': opt_L = 1; break;
    default: break;
    }
  }
  if (opt_L) treatstackoption(L, L1, "activelines");
  if (opt_f) treatstackoption(L, L1, "func");
  return 1;  /* Return result table. */
}